

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O0

TestStatus *
vkt::geometry::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,TestParams_conflict params)

{
  VkImage image;
  VkRenderPass VVar1;
  VkPipelineLayout pipelineLayout_00;
  VkShaderModule vertexModule_00;
  VkShaderModule geometryModule_00;
  VkShaderModule fragmentModule_00;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkExtent3D size;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkImageSubresourceRange subresourceRange;
  RefData<vk::Handle<(vk::HandleType)9>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)14>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)14>_> data_06;
  RefData<vk::Handle<(vk::HandleType)17>_> data_07;
  RefData<vk::Handle<(vk::HandleType)23>_> data_08;
  RefData<vk::Handle<(vk::HandleType)16>_> data_09;
  RefData<vk::Handle<(vk::HandleType)18>_> data_10;
  RefData<vk::Handle<(vk::HandleType)24>_> data_11;
  RefData<vk::VkCommandBuffer_s_*> data_12;
  undefined1 auVar4 [16];
  deUint32 numLayers_00;
  VkImageViewType viewType_00;
  bool bVar5;
  deUint32 queueFamilyIndex_00;
  int iVar6;
  int iVar7;
  uint uVar8;
  VkImageType flags;
  VkResult result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  NotSupportedError *this;
  MovePtr *vk_00;
  InstanceInterface *vki_00;
  VkDevice device_00;
  VkPhysicalDevice physDevice_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  TextureFormat format;
  Handle<(vk::HandleType)9> *pHVar10;
  Handle<(vk::HandleType)8> *pHVar11;
  ProgramCollection<vk::ProgramBinary> *pPVar12;
  ProgramBinary *pPVar13;
  Handle<(vk::HandleType)17> *pHVar14;
  Handle<(vk::HandleType)13> *pHVar15;
  Handle<(vk::HandleType)16> *pHVar16;
  Handle<(vk::HandleType)14> *pHVar17;
  Handle<(vk::HandleType)24> *pHVar18;
  Allocation *pAVar19;
  VkCommandBuffer_s **ppVVar20;
  Handle<(vk::HandleType)23> *pHVar21;
  Handle<(vk::HandleType)18> *pHVar22;
  VkDeviceSize offset;
  TestContext *this_00;
  TestLog *log;
  void *resultData;
  ulong bufferSize;
  uint uVar23;
  MovePtr *pMVar24;
  VkClearValue VVar25;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff42c;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  VkImageUsageFlags in_stack_fffffffffffff438;
  VkImageViewType local_91c;
  float local_914;
  byte local_8ea;
  allocator<char> local_8e9;
  string local_8e8;
  undefined4 local_8c8;
  allocator<char> local_8c1;
  string local_8c0;
  VkDeviceMemory local_8a0;
  undefined4 local_898 [2];
  VkBufferMemoryBarrier barriers_1 [1];
  undefined8 local_840;
  VkBufferImageCopy region;
  VkImageMemoryBarrier barriers [1];
  undefined1 auStack_7b4 [8];
  VkImageSubresourceRange colorSubresourceRange;
  undefined4 local_798 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkClearValue clearValue;
  Move<vk::VkCommandBuffer_s_*> local_730;
  RefData<vk::VkCommandBuffer_s_*> local_710;
  undefined1 local_6f0 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_6b0;
  undefined1 local_690 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_640;
  RefData<vk::Handle<(vk::HandleType)18>_> local_620;
  undefined1 local_600 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_5d8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_5b8;
  undefined1 local_598 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_568;
  RefData<vk::Handle<(vk::HandleType)23>_> local_548;
  undefined1 local_528 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_4e8;
  undefined1 local_4c8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  string local_4a0;
  Move<vk::Handle<(vk::HandleType)14>_> local_480;
  RefData<vk::Handle<(vk::HandleType)14>_> local_460;
  undefined1 local_440 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_418;
  Move<vk::Handle<(vk::HandleType)14>_> local_3f8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_3d8;
  undefined1 local_3b8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> geometryModule;
  string local_390;
  Move<vk::Handle<(vk::HandleType)14>_> local_370;
  RefData<vk::Handle<(vk::HandleType)14>_> local_350;
  undefined1 local_330 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_300;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_2f0;
  undefined1 local_2e0 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> local_298;
  RefData<vk::Handle<(vk::HandleType)8>_> local_278;
  undefined1 local_258 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  undefined8 uStack_230;
  deUint32 local_228;
  Move<vk::Handle<(vk::HandleType)13>_> local_218;
  RefData<vk::Handle<(vk::HandleType)13>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachment;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_198;
  undefined1 local_188 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  VkImageCreateInfo local_158;
  Move<vk::Handle<(vk::HandleType)9>_> local_100;
  RefData<vk::Handle<(vk::HandleType)9>_> local_e0;
  undefined1 local_c0 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> colorImage;
  VkImageViewType viewType;
  VkImageCreateFlags imageCreateFlags;
  VkDeviceSize colorBufferSize;
  Vec4 clearColor;
  deUint32 numLayers;
  VkFormat colorFormat;
  Allocator *allocator;
  VkQueue queue;
  deUint32 queueFamilyIndex;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  Context *local_18;
  Context *context_local;
  
  local_8ea = 0;
  local_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
    pvVar9 = Context::getDeviceExtensions_abi_cxx11_(context);
    local_20._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(pvVar9);
    pvVar9 = Context::getDeviceExtensions_abi_cxx11_(local_18);
    local_28._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar9);
    bVar5 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                      (&local_20,&local_28,(char (*) [20])0x1365e6b);
    local_8ea = bVar5 ^ 0xff;
  }
  if ((local_8ea & 1) == 0) {
    vk_00 = (MovePtr *)Context::getDeviceInterface(local_18);
    vki_00 = Context::getInstanceInterface(local_18);
    device_00 = Context::getDevice(local_18);
    physDevice_00 = Context::getPhysicalDevice(local_18);
    queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex(local_18);
    queue_00 = Context::getUniversalQueue(local_18);
    allocator_00 = Context::getDefaultAllocator(local_18);
    checkGeometryShaderSupport(vki_00,physDevice_00,0);
    clearColor.m_data[3] = 5.1848e-44;
    if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
      local_914 = (float)params.image.size.depth;
    }
    else {
      local_914 = (float)params.image.numLayers;
    }
    clearColor.m_data[2] = local_914;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&colorBufferSize,0.0,0.0,0.0,1.0);
    iVar6 = params.image.size.width * params.image.size.height * params.image.size.depth *
            params.image.numLayers;
    format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    iVar7 = tcu::getPixelSize(format);
    bufferSize = (ulong)(uint)(iVar6 * iVar7);
    bVar5 = isCubeImageViewType(params.image.viewType);
    uVar8 = 0;
    if (bVar5) {
      uVar8 = 0x10;
    }
    uVar23 = 0;
    if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
      uVar23 = 0x20;
    }
    if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
      local_91c = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
    }
    else {
      local_91c = params.image.viewType;
    }
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator._0_4_ =
         local_91c;
    colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator._4_4_ =
         uVar8 | uVar23;
    flags = getImageType(params.image.viewType);
    auVar4 = (undefined1  [16])params.image._4_16_;
    numLayers_00 = params.image.size.depth;
    colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
    _8_4_ = params.image.size.width;
    colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
    _12_4_ = params.image.size.height;
    params.image.numLayers = auVar4._12_4_;
    size.height = in_stack_fffffffffffff42c;
    size.width = params.image.numLayers;
    size.depth = 0x11;
    params.image._4_16_ = auVar4;
    makeImageCreateInfo(&local_158,(anon_unknown_0 *)(ulong)(uVar8 | uVar23),flags,0x25,auVar4._0_4_
                        ,size,numLayers_00,in_stack_fffffffffffff438);
    makeImage(&local_100,(DeviceInterface *)vk_00,device_00,&local_158);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
    uVar26 = (undefined4)local_e0.object.m_internal;
    uVar27 = (undefined4)(local_e0.object.m_internal >> 0x20);
    uVar28 = SUB84(local_e0.deleter.m_deviceIface,0);
    uVar29 = (undefined4)((ulong)local_e0.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_deviceIface._0_4_ = uVar28;
    data_01.object.m_internal = local_e0.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = uVar29;
    data_01.deleter.m_device._0_4_ = (int)local_e0.deleter.m_device;
    data_01.deleter.m_device._4_4_ = (int)((ulong)local_e0.deleter.m_device >> 0x20);
    data_01.deleter.m_allocator._0_4_ = (int)local_e0.deleter.m_allocator;
    data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_e0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_c0,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_100);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_c0);
    colorAttachment.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_
         = ::vk::MemoryRequirement::Any.m_flags;
    pMVar24 = vk_00;
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1a8,
              (DeviceInterface *)vk_00,device_00,allocator_00,(VkImage)pHVar10->m_internal,
              ::vk::MemoryRequirement::Any);
    local_198 = de::details::MovePtr::operator_cast_to_PtrData(&local_1a8,pMVar24);
    data.ptr._4_4_ = uVar27;
    data.ptr._0_4_ = uVar26;
    data._8_4_ = uVar28;
    data._12_4_ = uVar29;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_188,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1a8);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_c0);
    viewType_00 = (VkImageViewType)
                  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                  m_allocator;
    image.m_internal = pHVar10->m_internal;
    ::vk::makeImageSubresourceRange
              ((VkImageSubresourceRange *)
               &colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
               ,1,0,1,0,(deUint32)clearColor.m_data[2]);
    subresourceRange.levelCount = (int)uStack_230;
    subresourceRange._0_8_ =
         colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
    subresourceRange.baseArrayLayer = (int)((ulong)uStack_230 >> 0x20);
    subresourceRange.layerCount = local_228;
    makeImageView(&local_218,(DeviceInterface *)vk_00,device_00,image,viewType_00,
                  VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)&local_218);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_1f8.deleter.m_deviceIface;
    data_02.object.m_internal = local_1f8.object.m_internal;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1f8.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device._0_4_ = (int)local_1f8.deleter.m_device;
    data_02.deleter.m_device._4_4_ = (int)((ulong)local_1f8.deleter.m_device >> 0x20);
    data_02.deleter.m_allocator._0_4_ = (int)local_1f8.deleter.m_allocator;
    data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_1f8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_1d8,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_218);
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,bufferSize,2);
    makeBuffer(&local_298,(DeviceInterface *)vk_00,device_00,
               (VkBufferCreateInfo *)
               &colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_278,(Move *)&local_298);
    uVar26 = (undefined4)local_278.object.m_internal;
    uVar27 = (undefined4)(local_278.object.m_internal >> 0x20);
    uVar28 = SUB84(local_278.deleter.m_deviceIface,0);
    uVar29 = (undefined4)((ulong)local_278.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_deviceIface._0_4_ = uVar28;
    data_03.object.m_internal = local_278.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = uVar29;
    data_03.deleter.m_device._0_4_ = (int)local_278.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_278.deleter.m_device >> 0x20);
    data_03.deleter.m_allocator._0_4_ = (int)local_278.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_278.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_258,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_298);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_258);
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_ =
         ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar24 = vk_00;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_300,
               (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)pHVar11->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_2f0 = de::details::MovePtr::operator_cast_to_PtrData(&local_300,pMVar24);
    data_00.ptr._4_4_ = uVar27;
    data_00.ptr._0_4_ = uVar26;
    data_00._8_4_ = uVar28;
    data_00._12_4_ = uVar29;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2e0,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_300);
    pPVar12 = Context::getBinaryCollection(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"vert",
               (allocator<char> *)
               ((long)&geometryModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_390);
    ::vk::createShaderModule(&local_370,(DeviceInterface *)vk_00,device_00,pPVar13,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_350,(Move *)&local_370);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_350.deleter.m_deviceIface;
    data_04.object.m_internal = local_350.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_350.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device._0_4_ = (int)local_350.deleter.m_device;
    data_04.deleter.m_device._4_4_ = (int)((ulong)local_350.deleter.m_device >> 0x20);
    data_04.deleter.m_allocator._0_4_ = (int)local_350.deleter.m_allocator;
    data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_350.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_330,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&geometryModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar12 = Context::getBinaryCollection(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"geom",
               (allocator<char> *)
               ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_418);
    ::vk::createShaderModule(&local_3f8,(DeviceInterface *)vk_00,device_00,pPVar13,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_3d8,(Move *)&local_3f8);
    data_05.deleter.m_deviceIface._0_4_ = (int)local_3d8.deleter.m_deviceIface;
    data_05.object.m_internal = local_3d8.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3d8.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_device._0_4_ = (int)local_3d8.deleter.m_device;
    data_05.deleter.m_device._4_4_ = (int)((ulong)local_3d8.deleter.m_device >> 0x20);
    data_05.deleter.m_allocator._0_4_ = (int)local_3d8.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_3d8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_3b8,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar12 = Context::getBinaryCollection(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"frag",
               (allocator<char> *)
               ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar12,&local_4a0);
    ::vk::createShaderModule(&local_480,(DeviceInterface *)vk_00,device_00,pPVar13,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_460,(Move *)&local_480);
    data_06.deleter.m_deviceIface._0_4_ = (int)local_460.deleter.m_deviceIface;
    data_06.object.m_internal = local_460.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_460.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_device._0_4_ = (int)local_460.deleter.m_device;
    data_06.deleter.m_device._4_4_ = (int)((ulong)local_460.deleter.m_device >> 0x20);
    data_06.deleter.m_allocator._0_4_ = (int)local_460.deleter.m_allocator;
    data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_460.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_440,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                       m_allocator + 7));
    makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                   &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                    m_allocator,(DeviceInterface *)vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_4e8,
               (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                        m_allocator);
    data_07.deleter.m_deviceIface._0_4_ = (int)local_4e8.deleter.m_deviceIface;
    data_07.object.m_internal = local_4e8.object.m_internal;
    data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4e8.deleter.m_deviceIface >> 0x20);
    data_07.deleter.m_device._0_4_ = (int)local_4e8.deleter.m_device;
    data_07.deleter.m_device._4_4_ = (int)((ulong)local_4e8.deleter.m_device >> 0x20);
    data_07.deleter.m_allocator._0_4_ = (int)local_4e8.deleter.m_allocator;
    data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_4e8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_4c8,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)17>_> *)
               &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                m_allocator);
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_4c8);
    VVar1.m_internal = pHVar14->m_internal;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_1d8);
    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar15->m_internal;
    makeFramebuffer(&local_568,(DeviceInterface *)vk_00,device_00,VVar1,
                    (VkImageView)
                    pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                    m_allocator,params.image.size.width,params.image.size.height,
                    (deUint32)clearColor.m_data[2]);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_548,(Move *)&local_568);
    data_08.deleter.m_deviceIface._0_4_ = (int)local_548.deleter.m_deviceIface;
    data_08.object.m_internal = local_548.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_548.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_device._0_4_ = (int)local_548.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_548.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_548.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_548.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_528,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_568);
    ::vk::Handle<(vk::HandleType)19>::Handle
              ((Handle<(vk::HandleType)19> *)
               &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,0
              );
    makePipelineLayout(&local_5d8,(DeviceInterface *)vk_00,device_00,
                       (VkDescriptorSetLayout)
                       pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_5b8,(Move *)&local_5d8);
    data_09.deleter.m_deviceIface._0_4_ = (int)local_5b8.deleter.m_deviceIface;
    data_09.object.m_internal = local_5b8.object.m_internal;
    data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5b8.deleter.m_deviceIface >> 0x20);
    data_09.deleter.m_device._0_4_ = (int)local_5b8.deleter.m_device;
    data_09.deleter.m_device._4_4_ = (int)((ulong)local_5b8.deleter.m_device >> 0x20);
    data_09.deleter.m_allocator._0_4_ = (int)local_5b8.deleter.m_allocator;
    data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_5b8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_598,data_09);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_5d8);
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_598);
    pipelineLayout_00.m_internal = pHVar16->m_internal;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_4c8);
    VVar1.m_internal = pHVar14->m_internal;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_330);
    vertexModule_00.m_internal = pHVar17->m_internal;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_3b8);
    geometryModule_00.m_internal = pHVar17->m_internal;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_440);
    fragmentModule_00.m_internal = pHVar17->m_internal;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         ::vk::makeExtent2D(params.image.size.width,params.image.size.height);
    makeGraphicsPipeline
              (&local_640,(DeviceInterface *)vk_00,device_00,pipelineLayout_00,VVar1,vertexModule_00
               ,geometryModule_00,fragmentModule_00,
               (VkExtent2D)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_620,(Move *)&local_640);
    data_10.deleter.m_deviceIface._0_4_ = (int)local_620.deleter.m_deviceIface;
    data_10.object.m_internal = local_620.object.m_internal;
    data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_620.deleter.m_deviceIface >> 0x20);
    data_10.deleter.m_device._0_4_ = (int)local_620.deleter.m_device;
    data_10.deleter.m_device._4_4_ = (int)((ulong)local_620.deleter.m_device >> 0x20);
    data_10.deleter.m_allocator._0_4_ = (int)local_620.deleter.m_allocator;
    data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_620.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_600,data_10);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_640);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
               (DeviceInterface *)vk_00,device_00,2,queueFamilyIndex_00,(VkAllocationCallbacks *)0x0
              );
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_6b0,
               (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_11.deleter.m_deviceIface._0_4_ = (int)local_6b0.deleter.m_deviceIface;
    data_11.object.m_internal = local_6b0.object.m_internal;
    data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6b0.deleter.m_deviceIface >> 0x20);
    data_11.deleter.m_device._0_4_ = (int)local_6b0.deleter.m_device;
    data_11.deleter.m_device._4_4_ = (int)((ulong)local_6b0.deleter.m_device >> 0x20);
    data_11.deleter.m_allocator._0_4_ = (int)local_6b0.deleter.m_allocator;
    data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_6b0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_690,data_11);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_690);
    ::vk::allocateCommandBuffer
              (&local_730,(DeviceInterface *)vk_00,device_00,(VkCommandPool)pHVar18->m_internal,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_710,(Move *)&local_730);
    data_12.deleter.m_deviceIface._0_4_ = (int)local_710.deleter.m_deviceIface;
    data_12.object = local_710.object;
    data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_710.deleter.m_deviceIface >> 0x20);
    data_12.deleter.m_device._0_4_ = (int)local_710.deleter.m_device;
    data_12.deleter.m_device._4_4_ = (int)((ulong)local_710.deleter.m_device >> 0x20);
    data_12.deleter.m_pool.m_internal._0_4_ = (int)local_710.deleter.m_pool.m_internal;
    data_12.deleter.m_pool.m_internal._4_4_ = (int)(local_710.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_6f0,data_12);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_730);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator*((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2e0
                       );
    zeroBuffer((DeviceInterface *)vk_00,device_00,pAVar19,bufferSize);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar20);
    VVar25 = ::vk::makeClearValueColor((Vec4 *)&colorBufferSize);
    renderArea.extent = (VkExtent2D)VVar25.depthStencil;
    renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
    renderArea.offset =
         (VkOffset2D)::vk::makeExtent2D(params.image.size.width,params.image.size.height);
    local_798[0] = 0x2b;
    renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassBeginInfo._4_4_ = 0;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_4c8);
    renderPassBeginInfo.pNext = (void *)pHVar14->m_internal;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_528);
    renderPassBeginInfo.renderPass.m_internal = pHVar21->m_internal;
    renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
    renderPassBeginInfo.renderArea.offset = renderArea.offset;
    renderPassBeginInfo.renderArea.extent.width = 1;
    renderPassBeginInfo._48_8_ = &renderArea.extent;
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    (*(*(_func_int ***)vk_00)[0x74])(vk_00,*ppVVar20,local_798,0);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    pVVar2 = *ppVVar20;
    pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_600);
    colorSubresourceRange._12_8_ = pHVar22->m_internal;
    (*(*(_func_int ***)vk_00)[0x4c])(vk_00,pVVar2,0,colorSubresourceRange._12_8_);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    (*(*(_func_int ***)vk_00)[0x59])(vk_00,*ppVVar20,1);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    (*(*(_func_int ***)vk_00)[0x76])(vk_00,*ppVVar20);
    ::vk::makeImageSubresourceRange
              ((VkImageSubresourceRange *)auStack_7b4,1,0,1,0,params.image.numLayers);
    region.imageExtent.height = 0x2d;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
              ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_c0);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    (*(*(_func_int ***)vk_00)[0x6d])
              (vk_00,*ppVVar20,0x400,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
    local_840 = 0;
    region.bufferOffset._0_4_ = 0;
    region.bufferOffset._4_4_ = 0;
    region._8_16_ = ::vk::makeImageSubresourceLayers(1,0,0,params.image.numLayers);
    region._24_12_ = ::vk::makeOffset3D(0,0,0);
    auVar4 = (undefined1  [16])params.image._4_16_;
    region.imageExtent.width = params.image.size.depth;
    region.imageOffset.y = params.image.size.width;
    region.imageOffset.z = params.image.size.height;
    params.image._4_16_ = auVar4;
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    pVVar2 = *ppVVar20;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_c0);
    dVar3 = pHVar10->m_internal;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_258);
    barriers_1[0].size = pHVar11->m_internal;
    (*(*(_func_int ***)vk_00)[99])(vk_00,pVVar2,dVar3,6,barriers_1[0].size,1,(int)&local_840);
    local_898[0] = 0x2c;
    barriers_1[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    barriers_1[0]._4_4_ = 0;
    barriers_1[0].pNext._0_4_ = 0x1000;
    barriers_1[0].pNext._4_4_ = 0x2000;
    barriers_1[0].srcAccessMask = 0xffffffff;
    barriers_1[0].dstAccessMask = 0xffffffff;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_258);
    barriers_1[0]._24_8_ = pHVar11->m_internal;
    barriers_1[0].buffer.m_internal = 0;
    barriers_1[0].offset = 0xffffffffffffffff;
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar20,0x1000,0x4000,0,0,0,1,(int)local_898,0,0);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    result = (*(*(_func_int ***)vk_00)[0x4a])(vk_00,*ppVVar20);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                      ,0x3fc);
    ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_6f0);
    submitCommandsAndWait((DeviceInterface *)vk_00,device_00,queue_00,*ppVVar20);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_2e0);
    local_8a0 = ::vk::Allocation::getMemory(pAVar19);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_2e0);
    offset = ::vk::Allocation::getOffset(pAVar19);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vk_00,device_00,local_8a0,offset,bufferSize);
    this_00 = Context::getTestContext(local_18);
    log = tcu::TestContext::getLog(this_00);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_2e0);
    resultData = ::vk::Allocation::getHostPtr(pAVar19);
    bVar5 = verifyResults(log,&params,VK_FORMAT_R8G8B8A8_UNORM,resultData);
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"OK",&local_8e9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_8e8);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::allocator<char>::~allocator(&local_8e9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"Rendered images are incorrect",&local_8c1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::allocator<char>::~allocator(&local_8c1);
    }
    local_8c8 = 1;
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_6f0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_690);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_600);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_598);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_528);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_4c8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_440);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_3b8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_330);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2e0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_258);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_1d8);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_188);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_c0);
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
             ,0x381);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestStatus test (Context& context, const TestParams params)
{
	if (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType &&
		(!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1")))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const DeviceInterface&			vk						= context.getDeviceInterface();
	const InstanceInterface&		vki						= context.getInstanceInterface();
	const VkDevice					device					= context.getDevice();
	const VkPhysicalDevice			physDevice				= context.getPhysicalDevice();
	const deUint32					queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= context.getUniversalQueue();
	Allocator&						allocator				= context.getDefaultAllocator();

	checkGeometryShaderSupport(vki, physDevice);

	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const deUint32					numLayers				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? params.image.size.depth : params.image.numLayers);
	const Vec4						clearColor				= Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize				colorBufferSize			= params.image.size.width * params.image.size.height * params.image.size.depth * params.image.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const VkImageCreateFlags		imageCreateFlags		= (isCubeImageViewType(params.image.viewType) ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlagBits)0) |
															  (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_CREATE_2D_ARRAY_COMPATIBLE_BIT_KHR : (VkImageCreateFlagBits)0);
	const VkImageViewType			viewType				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_VIEW_TYPE_2D_ARRAY : params.image.viewType);

	const Unique<VkImage>			colorImage				(makeImage				(vk, device, makeImageCreateInfo(imageCreateFlags, getImageType(params.image.viewType), colorFormat, params.image.size,
																					 params.image.numLayers, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT)));
	const UniquePtr<Allocation>		colorImageAlloc			(bindImage				(vk, device, allocator, *colorImage, MemoryRequirement::Any));
	const Unique<VkImageView>		colorAttachment			(makeImageView			(vk, device, *colorImage, viewType, colorFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));

	const Unique<VkBuffer>			colorBuffer				(makeBuffer				(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc		(bindBuffer				(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	const Unique<VkShaderModule>	vertexModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	geometryModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("geom"), 0u));
	const Unique<VkShaderModule>	fragmentModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkRenderPass>		renderPass				(makeRenderPass			(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer		(vk, device, *renderPass, *colorAttachment, params.image.size.width,  params.image.size.height, numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout			(makePipelineLayout		(vk, device));
	const Unique<VkPipeline>		pipeline				(makeGraphicsPipeline	(vk, device, *pipelineLayout, *renderPass, *vertexModule, *geometryModule, *fragmentModule,
																					 makeExtent2D(params.image.size.width, params.image.size.height)));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool		(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer	(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	beginCommandBuffer(vk, *cmdBuffer);

	const VkClearValue			clearValue	= makeClearValueColor(clearColor);
	const VkRect2D				renderArea	=
	{
		makeOffset2D(0, 0),
		makeExtent2D(params.image.size.width, params.image.size.height),
	};
	const VkRenderPassBeginInfo renderPassBeginInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		*renderPass,									// VkRenderPass            renderPass;
		*framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		1u,												// uint32_t                clearValueCount;
		&clearValue,									// const VkClearValue*     pClearValues;
	};
	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Prepare color image for copy
	{
		const VkImageSubresourceRange	colorSubresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, params.image.numLayers);
		const VkImageMemoryBarrier		barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
				DE_NULL,										// const void*				pNext;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			outputMask;
				VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			inputMask;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
				VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout			newLayout;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
				*colorImage,									// VkImage					image;
				colorSubresourceRange,							// VkImageSubresourceRange	subresourceRange;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
	}
	// Color image -> host buffer
	{
		const VkBufferImageCopy region =
		{
			0ull,																						// VkDeviceSize                bufferOffset;
			0u,																							// uint32_t                    bufferRowLength;
			0u,																							// uint32_t                    bufferImageHeight;
			makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, params.image.numLayers),		// VkImageSubresourceLayers    imageSubresource;
			makeOffset3D(0, 0, 0),																		// VkOffset3D                  imageOffset;
			params.image.size,																			// VkExtent3D                  imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);
	}
	// Buffer write barrier
	{
		const VkBufferMemoryBarrier barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
				DE_NULL,										// const void*        pNext;
				VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
				VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
				*colorBuffer,									// VkBuffer           buffer;
				0ull,											// VkDeviceSize       offset;
				VK_WHOLE_SIZE,									// VkDeviceSize       size;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), colorBufferSize);

	if (!verifyResults(context.getTestContext().getLog(), params, colorFormat, colorBufferAlloc->getHostPtr()))
		return tcu::TestStatus::fail("Rendered images are incorrect");
	else
		return tcu::TestStatus::pass("OK");
}